

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryInputWindow.cpp
# Opt level: O2

void __thiscall
QueryInputWindow::QueryInputWindow
          (QueryInputWindow *this,MySQLConnector *connector,QueryOutputWindow *outputWindow)

{
  (this->super_IWindow)._vptr_IWindow = (_func_int **)&PTR__QueryInputWindow_00109ca0;
  (this->buffer)._M_dataplus._M_p = (pointer)&(this->buffer).field_2;
  (this->buffer)._M_string_length = 0;
  (this->buffer).field_2._M_local_buf[0] = '\0';
  this->cursorOffset = 0;
  this->connector = connector;
  this->outputWindow = outputWindow;
  resize(this,0,4);
  init_pair(2,0,7);
  wbkgd((this->super_IWindow).window,0x200);
  keypad((this->super_IWindow).window,1);
  _ESCDELAY = 10;
  (*(this->super_IWindow)._vptr_IWindow[5])(this);
  return;
}

Assistant:

QueryInputWindow::QueryInputWindow(MySQLConnector *connector, QueryOutputWindow *outputWindow)
{
	this->cursorOffset = 0;
	this->connector = connector;
	this->outputWindow = outputWindow;

	this->resize(0, 4);

	init_pair(COLOUR_SCHEME_INPUT, COLOUR_SCHEME_PRIMARY, COLOUR_SCHEME_SECONDARY);
	wbkgd(this->window, COLOR_PAIR(COLOUR_SCHEME_INPUT));

	// enabled so that when checking for esc (code 27) key presses, arrow keys,
	// page up/down, etc do not register
	// without it the right arrow key, for example, triggers escape because it 
	// outputs ^E
	keypad(this->window, true);
	// ncurses uses escape to start character sequences and so has a default delay
	// of 1000 milliseconds on the escape key
	ESCDELAY = 10;

	this->refresh();
}